

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentShader.hpp
# Opt level: O0

Vector3<double> *
eos::render::compute_inverse_perspectively_correct_lambda<double>
          (Vector3<double> *__return_storage_ptr__,Vector3<double> *lambda_world,double *one_over_w0
          ,double *one_over_w1,double *one_over_w2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  float fVar6;
  float d;
  float w2;
  float w1;
  float w0;
  double *one_over_w2_local;
  double *one_over_w1_local;
  double *one_over_w0_local;
  Vector3<double> *lambda_world_local;
  Vector3<double> *lambda;
  
  fVar6 = (float)(1.0 / *one_over_w0);
  dVar1 = *one_over_w1;
  dVar2 = *one_over_w2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::y
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)lambda_world);
  dVar3 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::z
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)lambda_world);
  fVar6 = (float)(-(double)(fVar6 - (float)(1.0 / dVar2)) * *pdVar4 +
                 -(double)(fVar6 - (float)(1.0 / dVar1)) * dVar3 + (double)fVar6);
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(__return_storage_ptr__);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::z
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)lambda_world);
    dVar3 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::z
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        __return_storage_ptr__);
    *pSVar5 = (dVar3 * (double)(float)(1.0 / dVar2)) / (double)fVar6;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)lambda_world);
    dVar2 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        __return_storage_ptr__);
    *pSVar5 = (dVar2 * (double)(float)(1.0 / dVar1)) / (double)fVar6;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        __return_storage_ptr__);
    dVar1 = *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::z
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        __return_storage_ptr__);
    dVar2 = *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        __return_storage_ptr__);
    *pSVar5 = (1.0 - dVar1) - dVar2;
  }
  else {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(__return_storage_ptr__,lambda_world);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3<T> compute_inverse_perspectively_correct_lambda(const Eigen::Vector3<T>& lambda_world,
                                                               const T& one_over_w0, const T& one_over_w1,
                                                               const T& one_over_w2)
{
    const float w0 = 1 / one_over_w0;
    const float w1 = 1 / one_over_w1;
    const float w2 = 1 / one_over_w2;

    const float d = w0 - (w0 - w1) * lambda_world.y() - (w0 - w2) * lambda_world.z();
    if (d == 0)
        return lambda_world;

    Eigen::Vector3<T> lambda;

    lambda.z() = lambda_world.z() * w2 / d;
    lambda.y() = lambda_world.y() * w1 / d;

    lambda.x() = 1 - lambda.y() - lambda.z();
    return lambda;
}